

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error.cpp
# Opt level: O2

string * __thiscall
ot::commissioner::ErrorCodeToString_abi_cxx11_
          (string *__return_storage_ptr__,commissioner *this,ErrorCode code)

{
  char *pcVar1;
  allocator local_9;
  
  switch((ulong)this & 0xffffffff) {
  case 0:
    pcVar1 = "OK";
    break;
  case 1:
    pcVar1 = "CANCELLED";
    break;
  case 2:
    pcVar1 = "INVALID_ARGS";
    break;
  case 3:
    pcVar1 = "INVALID_COMMAND";
    break;
  case 4:
    pcVar1 = "TIMEOUT";
    break;
  case 5:
    pcVar1 = "NOT_FOUND";
    break;
  case 6:
    pcVar1 = "SECURITY";
    break;
  case 7:
    pcVar1 = "UNIMPLEMENTED";
    break;
  case 8:
    pcVar1 = "BAD_FORMAT";
    break;
  case 9:
    pcVar1 = "BUSY";
    break;
  case 10:
    pcVar1 = "OUT_OF_MEMORY";
    break;
  case 0xb:
    pcVar1 = "IO_ERROR";
    break;
  case 0xc:
    pcVar1 = "IO_BUSY";
    break;
  case 0xd:
    pcVar1 = "ALREADY_EXISTS";
    break;
  case 0xe:
    pcVar1 = "ABORTED";
    break;
  case 0xf:
    pcVar1 = "INVALID_STATE";
    break;
  case 0x10:
    pcVar1 = "REJECTED";
    break;
  case 0x11:
    pcVar1 = "COAP_ERROR";
    break;
  case 0x12:
    pcVar1 = "REGISTRY_ERROR";
    break;
  case 0x13:
    pcVar1 = "UNKNOWN";
    break;
  default:
    abort();
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar1,&local_9);
  return __return_storage_ptr__;
}

Assistant:

std::string ErrorCodeToString(ErrorCode code)
{
    switch (code)
    {
    case ErrorCode::kNone:
        return "OK";
    case ErrorCode::kCancelled:
        return "CANCELLED";
    case ErrorCode::kInvalidArgs:
        return "INVALID_ARGS";
    case ErrorCode::kInvalidCommand:
        return "INVALID_COMMAND";
    case ErrorCode::kTimeout:
        return "TIMEOUT";
    case ErrorCode::kNotFound:
        return "NOT_FOUND";
    case ErrorCode::kSecurity:
        return "SECURITY";
    case ErrorCode::kUnimplemented:
        return "UNIMPLEMENTED";
    case ErrorCode::kBadFormat:
        return "BAD_FORMAT";
    case ErrorCode::kBusy:
        return "BUSY";
    case ErrorCode::kOutOfMemory:
        return "OUT_OF_MEMORY";
    case ErrorCode::kIOError:
        return "IO_ERROR";
    case ErrorCode::kIOBusy:
        return "IO_BUSY";
    case ErrorCode::kAlreadyExists:
        return "ALREADY_EXISTS";
    case ErrorCode::kAborted:
        return "ABORTED";
    case ErrorCode::kInvalidState:
        return "INVALID_STATE";
    case ErrorCode::kRejected:
        return "REJECTED";
    case ErrorCode::kCoapError:
        return "COAP_ERROR";
    case ErrorCode::kRegistryError:
        return "REGISTRY_ERROR";
    case ErrorCode::kUnknown:
        return "UNKNOWN";

    default:
        VerifyOrDie(false);
        return "UNKNOWN";
    }
}